

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zdd.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int res;
  
  lace_start(1,0);
  sylvan_set_sizes(0x4000000,0x4000000,0x100000,0x100000);
  sylvan_init_package();
  sylvan_init_mtbdd();
  sylvan_init_zdd();
  iVar1 = runtests_RUN();
  sylvan_quit();
  lace_stop();
  return iVar1;
}

Assistant:

int main()
{
    // Standard Lace initialization with 1 worker
	lace_start(1, 0);

    // Simple Sylvan initialization, also initialize BDD, MTBDD and LDD support
	sylvan_set_sizes(1LL<<26, 1LL<<26, 1LL<<20, 1LL<<20);
	sylvan_init_package();
    sylvan_init_mtbdd();
    sylvan_init_zdd();

    int res = RUN(runtests);

    sylvan_quit();
    lace_stop();

    return res;
}